

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

boolean throwing_weapon(obj *obj)

{
  bool local_11;
  obj *obj_local;
  
  if (((((obj->oclass != '\x02') && (obj->oclass != '\x06')) ||
       (objects[obj->otyp].oc_subtyp < -0x1b)) ||
      (local_11 = true, -0x19 < objects[obj->otyp].oc_subtyp)) &&
     (((((obj->oclass != '\x02' || (objects[obj->otyp].oc_subtyp < '\x12')) ||
        (local_11 = true, '\x13' < objects[obj->otyp].oc_subtyp)) &&
       (((obj->oclass != '\x02' || (objects[obj->otyp].oc_subtyp < '\x01')) ||
        ((('\n' < objects[obj->otyp].oc_subtyp ||
          (((obj->oclass == '\x02' && ('\x04' < objects[obj->otyp].oc_subtyp)) &&
           (objects[obj->otyp].oc_subtyp < '\v')))) ||
         (local_11 = true, (*(ushort *)&objects[obj->otyp].field_0x11 >> 2 & 1) == 0)))))) &&
      (local_11 = true, obj->otyp != 0x3b)))) {
    local_11 = obj->otyp == 0x3f;
  }
  return local_11;
}

Assistant:

boolean throwing_weapon(const struct obj *obj)
{
	return (is_missile(obj) || is_spear(obj) ||
		/* daggers and knife (excludes scalpel) */
		(is_blade(obj) && !is_sword(obj) &&
		 (objects[obj->otyp].oc_dir & PIERCE)) ||
		/* special cases [might want to add AXE] */
		obj->otyp == WAR_HAMMER || obj->otyp == AKLYS);
}